

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O2

void __thiscall HighsIis::addCol(HighsIis *this,HighsInt col,HighsInt status)

{
  HighsInt local_18;
  HighsInt local_14;
  
  _local_18 = CONCAT44(col,status);
  std::vector<int,_std::allocator<int>_>::push_back(&this->col_index_,&local_14);
  std::vector<int,_std::allocator<int>_>::push_back(&this->col_bound_,&local_18);
  return;
}

Assistant:

void HighsIis::addCol(const HighsInt col, const HighsInt status) {
  this->col_index_.push_back(col);
  this->col_bound_.push_back(status);
}